

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles2::Functional::eval_selection_ivec3(ShaderEvalContext *c)

{
  float fVar1;
  Vector<float,_3> *v;
  Vector<float,_3> local_60;
  Vector<float,_3> local_54;
  Vector<int,_3> local_48;
  Vector<float,_3> local_3c;
  VecAccess<float,_4,_3> local_30;
  
  fVar1 = c->in[0].m_data[2];
  tcu::Vector<float,_3>::cast<int>(&local_54);
  tcu::Vector<float,_3>::cast<int>(&local_60);
  v = &local_60;
  if (0.0 < fVar1) {
    v = &local_54;
  }
  tcu::Vector<int,_3>::Vector(&local_48,(Vector<int,_3> *)v);
  tcu::Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_3c);
  local_30.m_vector = &c->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,&local_3c);
  return;
}

Assistant:

void eval_selection_ivec3	(ShaderEvalContext& c) { c.color.xyz()	= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(1, 2, 0).asInt(),		c.in[2].swizzle(3, 1, 2).asInt()).asFloat(); }